

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  *(undefined8 *)(this_00 + 1) = 0x19bf958;
  *(undefined8 *)this_00 = 0x19bfa20;
  *(undefined4 *)&this_00[1].fMesh =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)((long)&this_00[1].fMesh + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019bf280,(TPZStructMatrix *)this);
  *(undefined8 *)(this_00 + 1) = 0x19bf438;
  *(undefined8 *)this_00 = 0x19bf358;
  TPZStructMatrixTBBFlow<std::complex<double>_>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<std::complex<double>_> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019bf2a8,
             (TPZStructMatrixTBBFlow<std::complex<double>_> *)
             &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa0
            );
  *(undefined8 *)(this_00 + 1) = 0x19bf200;
  *(undefined8 *)this_00 = 0x19bf038;
  *(undefined8 *)&this_00->field_0xa0 = 0x19bf108;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZSpStructMatrix(*this);
}